

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  localization_backend_manager mgr;
  string local_50 [8];
  localization_backend_manager local_48 [8];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  booster::locale::localization_backend_manager::global();
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"posix","");
  booster::locale::localization_backend_manager::select(local_50,(uint)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  booster::locale::localization_backend_manager::global(local_48);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing char",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  test_char<char>();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing wchar_t",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  test_char<wchar_t>();
  booster::locale::localization_backend_manager::~localization_backend_manager
            ((localization_backend_manager *)local_50);
  iVar3 = test_counter - error_counter;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Passed ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < error_counter) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,error_counter);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," tests",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  lVar1 = std::cout;
  *(uint *)(std::locale::~locale + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::~locale + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 1;
  *(undefined8 *)(std::runtime_error::what + *(long *)(lVar1 + -0x18)) = 5;
  poVar2 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"% of tests completed sucsessefully",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("posix");
        booster::locale::localization_backend_manager::global(mgr);

        std::cout << "Testing char" << std::endl;
        test_char<char>();
        std::cout << "Testing wchar_t" << std::endl;
        test_char<wchar_t>();
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}